

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analyzer.cpp
# Opt level: O2

void __thiscall SQCompilation::CheckerVisitor::checkForgotSubst(CheckerVisitor *this,LiteralExpr *l)

{
  char cVar1;
  TreeOp TVar2;
  pointer pSVar3;
  int iVar4;
  char *pcVar5;
  char *pcVar6;
  char *pcVar7;
  Expr *pEVar8;
  LiteralExpr *pLVar9;
  pointer pSVar10;
  Node *pNVar11;
  
  if ((this->effectsOnly == false) && (l->_kind == LK_STRING)) {
    pSVar3 = (this->nodeStack).
             super__Vector_base<SQCompilation::CheckerVisitor::StackSlot,_std::allocator<SQCompilation::CheckerVisitor::StackSlot>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    do {
      pSVar10 = pSVar3;
      if (pSVar10 ==
          (this->nodeStack).
          super__Vector_base<SQCompilation::CheckerVisitor::StackSlot,_std::allocator<SQCompilation::CheckerVisitor::StackSlot>_>
          ._M_impl.super__Vector_impl_data._M_start) {
        pNVar11 = (Node *)0x0;
        break;
      }
      pSVar3 = pSVar10 + -1;
    } while ((pSVar10[-1].sst != SST_NODE) ||
            (pNVar11 = pSVar10[-1].field_1.n, pNVar11->_op != TO_CALL));
    pcVar7 = (l->_v).s;
    pcVar5 = strchr(pcVar7,0x7b);
    if (pcVar5 == (char *)0x0) {
      return;
    }
    cVar1 = pcVar5[1];
    iVar4 = isalpha((int)cVar1);
    if ((cVar1 != 0x5f) && (iVar4 == 0)) {
      return;
    }
    pcVar6 = strstr(pcVar7,":i=");
    if (pcVar6 != (char *)0x0) {
      return;
    }
    pcVar6 = strstr(pcVar7,":r=");
    if (pcVar6 != (char *)0x0) {
      return;
    }
    pcVar6 = strstr(pcVar7,":t=");
    if (pcVar6 != (char *)0x0) {
      return;
    }
    pcVar6 = strstr(pcVar7,":p2=");
    if (pcVar6 != (char *)0x0) {
      return;
    }
    pcVar6 = strstr(pcVar7,":p3=");
    if (pcVar6 != (char *)0x0) {
      return;
    }
    pcVar7 = strstr(pcVar7,":tm=");
    if (cVar1 == '\0') {
      return;
    }
    if (pcVar7 != (char *)0x0) {
      return;
    }
    pcVar7 = strchr(pcVar5 + 2,0x7d);
    if (pcVar7 == (char *)0x0) {
      return;
    }
    if (pNVar11 == (Node *)0x0) goto LAB_001442a8;
    pEVar8 = deparen((Expr *)pNVar11[1].super_ArenaObj._vptr_ArenaObj);
    TVar2 = (pEVar8->super_Node)._op;
    if (TVar2 == TO_ID) {
      iVar4 = strcmp("loc",(char *)pEVar8[1].super_Node.super_ArenaObj._vptr_ArenaObj);
      if ((iVar4 != 0) || (pNVar11[1]._op < TO_WHILE)) goto LAB_001442a8;
      pEVar8 = *(Expr **)(*(long *)&pNVar11[1]._coordinates.lineEnd + 8);
    }
    else {
      if (TVar2 != TO_GETFIELD) goto LAB_001442a8;
      pcVar7 = *(char **)&pEVar8[1].super_Node._coordinates.lineEnd;
      pLVar9 = (LiteralExpr *)deparen((Expr *)pEVar8[1].super_Node.super_ArenaObj._vptr_ArenaObj);
      if (pLVar9 == l) {
        iVar4 = strcmp(pcVar7,"subst");
        if (iVar4 == 0) {
          return;
        }
        goto LAB_001442a8;
      }
      iVar4 = strcmp(pcVar7,"split");
      if ((iVar4 != 0) || (pNVar11[1]._op == TO_BLOCK)) goto LAB_001442a8;
      pEVar8 = (Expr *)**(undefined8 **)&pNVar11[1]._coordinates.lineEnd;
    }
    pLVar9 = (LiteralExpr *)deparen(pEVar8);
    if (pLVar9 != l) {
LAB_001442a8:
      report(this,(Node *)l,0x6f);
      return;
    }
  }
  return;
}

Assistant:

void CheckerVisitor::checkForgotSubst(const LiteralExpr *l) {
  if (effectsOnly)
    return;

  if (l->kind() != LK_STRING)
    return;

  const CallExpr *candidate = nullptr;

  for (auto it = nodeStack.rbegin(); it != nodeStack.rend(); ++it) {
    if (it->sst != SST_NODE)
      continue;

    const Node *n = it->n;

    if (n->op() == TO_CALL) {
      candidate = static_cast<const CallExpr *>(n);
      break;
    }
  }

  const SQChar *s = l->s();
  if (!stringLooksLikeFormatTemplate(s)) {
    return;
  }

  bool ok = false;

  if (candidate) {
    const Expr *callee = deparen(candidate->callee());
    const auto &arguments = candidate->arguments();
    if (callee->op() == TO_GETFIELD) { // -V522
      const GetFieldExpr *f = callee->asGetField();
      const SQChar *funcName = f->fieldName();
      if (deparen(f->receiver()) == l) {
        ok = strcmp(funcName, "subst") == 0;
      } else if (strcmp(funcName, "split") == 0) {
        ok = arguments.size() >= 1 && deparen(arguments[0]) == l;;
      }
    }
    else if (callee->op() == TO_ID) { // -V522
      if (strcmp("loc", callee->asId()->id()) == 0) {
        ok = arguments.size() >= 2 && deparen(arguments[1]) == l;
      }
    }
  }

  if (!ok)
    report(l, DiagnosticsId::DI_FORGOT_SUBST);
}